

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_mismatch.cpp
# Opt level: O0

void __thiscall
cpp_db::type_mismatch::type_mismatch(type_mismatch *this,type_index *src_type,type_index *dest_type)

{
  char *pcVar1;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  type_index *local_20;
  type_index *dest_type_local;
  type_index *src_type_local;
  type_mismatch *this_local;
  
  local_20 = dest_type;
  dest_type_local = src_type;
  src_type_local = (type_index *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Value type \'",&local_c1);
  pcVar1 = std::type_index::name(local_20);
  std::operator+(&local_a0,&local_c0,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"\' is not convertible to \'",&local_f9);
  std::operator+(&local_80,&local_a0,&local_f8);
  pcVar1 = std::type_index::name(dest_type_local);
  std::operator+(&local_60,&local_80,pcVar1);
  std::operator+(&local_40,&local_60,"\'");
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  *(undefined ***)this = &PTR__type_mismatch_00241cd0;
  return;
}

Assistant:

type_mismatch::type_mismatch(const std::type_index &src_type, const std::type_index &dest_type)
    : std::runtime_error(std::string("Value type '")
                            +dest_type.name()
                            + std::string("' is not convertible to '")
                            + src_type.name()+"'"
                         )
{
}